

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp.c
# Opt level: O3

void nhdp_set_originator(netaddr *addr)

{
  undefined8 uVar1;
  ulong uVar2;
  netaddr_str buf;
  
  uVar2 = (ulong)LOG_NHDP;
  if (((&log_global_mask)[uVar2] & 1) != 0) {
    uVar1 = netaddr_to_prefixstring(&buf,addr,0);
    oonf_log(1,uVar2,"src/nhdp/nhdp/nhdp.c",0xfc,0,0,"Set originator to %s",uVar1);
  }
  if (addr->_type == '\n') {
    _originator_v6._type = addr->_type;
    _originator_v6._prefix_len = addr->_prefix_len;
    _originator_v6._addr._0_8_ = *(undefined8 *)addr->_addr;
    _originator_v6._addr._8_8_ = *(undefined8 *)(addr->_addr + 8);
  }
  else if (addr->_type == '\x02') {
    _originator_v4._type = addr->_type;
    _originator_v4._prefix_len = addr->_prefix_len;
    _originator_v4._addr._0_8_ = *(undefined8 *)addr->_addr;
    _originator_v4._addr._8_8_ = *(undefined8 *)(addr->_addr + 8);
  }
  return;
}

Assistant:

void
nhdp_set_originator(const struct netaddr *addr) {
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf;
#endif

  OONF_DEBUG(LOG_NHDP, "Set originator to %s", netaddr_to_string(&buf, addr));
  if (netaddr_get_address_family(addr) == AF_INET) {
    memcpy(&_originator_v4, addr, sizeof(*addr));
  }
  else if (netaddr_get_address_family(addr) == AF_INET6) {
    memcpy(&_originator_v6, addr, sizeof(*addr));
  }
}